

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  void *__src;
  void *__dest;
  Mat m_3;
  Mat m_2;
  Mat m_7;
  Mat m_1;
  Mat m;
  Mat m_6;
  Mat local_c8;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->num_output,4,opt->workspace_allocator);
  iVar3 = -100;
  if (local_78.data == (void *)0x0) goto LAB_0032c1ca;
  if (local_78.cstep * (long)local_78.c == 0) goto LAB_0032c1ca;
  uVar4 = (int)local_78.cstep * local_78.c;
  uVar6 = 0;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar7 = uVar6;
  }
  for (; (int)uVar7 != (int)uVar6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)local_78.data + uVar6 * 4) = 0;
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,this->hidden_size,4,opt->workspace_allocator);
  iVar3 = -100;
  if (local_c8.data != (void *)0x0) {
    if (local_c8.cstep * (long)local_c8.c != 0) {
      uVar4 = (int)local_c8.cstep * local_c8.c;
      uVar6 = 0;
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar7 = uVar6;
      }
      for (; (int)uVar7 != (int)uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)local_c8.data + uVar6 * 4) = 0;
      }
      Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar4 = this->direction;
        if (uVar4 < 2) {
          m.w = (this->weight_xc_data).w;
          m.h = (this->weight_xc_data).h;
          m.data = (this->weight_xc_data).data;
          uVar7 = (this->weight_xc_data).elemsize;
          m.elempack = (this->weight_xc_data).elempack;
          m.allocator = (this->weight_xc_data).allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar7;
          m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m.c = (this->weight_xc_data).d;
          m.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m.dims = iVar1 + -1;
          m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          m_1.w = (this->bias_c_data).w;
          m_1.h = (this->bias_c_data).h;
          m_1.data = (this->bias_c_data).data;
          uVar7 = (this->bias_c_data).elemsize;
          m_1.elempack = (this->bias_c_data).elempack;
          m_1.allocator = (this->bias_c_data).allocator;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = (undefined4)uVar7;
          m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_1.c = (this->bias_c_data).d;
          m_1.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_1.dims = iVar1 + -1;
          m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m_1.cstep = (long)m_1.h * (long)m_1.w;
          }
          m_2.w = (this->weight_hc_data).w;
          m_2.h = (this->weight_hc_data).h;
          m_2.c = (this->weight_hc_data).d;
          m_2.data = (this->weight_hc_data).data;
          m_2.elemsize = (this->weight_hc_data).elemsize;
          m_2.elempack = (this->weight_hc_data).elempack;
          m_2.allocator = (this->weight_hc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          if (this->num_output == this->hidden_size) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
          }
          else {
            m_3.w = (this->weight_hr_data).w;
            m_3.h = (this->weight_hr_data).h;
            m_3.data = (this->weight_hr_data).data;
            uVar7 = (this->weight_hr_data).elemsize;
            m_3.elempack = (this->weight_hr_data).elempack;
            m_3.allocator = (this->weight_hr_data).allocator;
            m_3.elemsize._0_4_ = (undefined4)uVar7;
            m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_3.c = (this->weight_hr_data).d;
            m_3.d = 1;
            iVar1 = (this->weight_hr_data).dims;
            m_3.dims = iVar1 + -1;
            m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_3.cstep = (long)m_3.h * (long)m_3.w;
            }
          }
          m_3.refcount._4_4_ = 0;
          m_3.refcount._0_4_ = 0;
          iVar3 = lstm(bottom_blob,top_blob,uVar4,&m,&m_1,&m_2,&m_3,&local_78,&local_c8,opt);
          if (iVar3 != 0) goto LAB_0032c193;
          uVar4 = this->direction;
        }
        if (uVar4 == 2) {
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.allocator = (Allocator *)0x0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
          iVar3 = -100;
          if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
            cVar5 = '\0';
          }
          else {
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.allocator = (Allocator *)0x0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
            iVar3 = -100;
            if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
              uVar7 = 0;
            }
            else {
              m_2.w = (this->weight_xc_data).w;
              m_2.h = (this->weight_xc_data).h;
              m_2.c = (this->weight_xc_data).d;
              m_2.data = (this->weight_xc_data).data;
              m_2.elemsize = (this->weight_xc_data).elemsize;
              m_2.elempack = (this->weight_xc_data).elempack;
              m_2.allocator = (this->weight_xc_data).allocator;
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_2.dims = iVar1 + -1;
              m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                          m_2.elemsize;
              if (iVar1 == 4) {
                m_2.cstep = (long)m_2.h * (long)m_2.w;
              }
              m_3.w = (this->bias_c_data).w;
              m_3.h = (this->bias_c_data).h;
              m_3.data = (this->bias_c_data).data;
              uVar7 = (this->bias_c_data).elemsize;
              m_3.elempack = (this->bias_c_data).elempack;
              m_3.allocator = (this->bias_c_data).allocator;
              m_3.refcount._0_4_ = 0;
              m_3.refcount._4_4_ = 0;
              m_3.elemsize._0_4_ = (undefined4)uVar7;
              m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
              m_3.c = (this->bias_c_data).d;
              m_3.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_3.dims = iVar1 + -1;
              m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
              if (iVar1 == 4) {
                m_3.cstep = (long)m_3.h * (long)m_3.w;
              }
              m_6.w = (this->weight_hc_data).w;
              m_6.h = (this->weight_hc_data).h;
              m_6.c = (this->weight_hc_data).d;
              m_6.data = (this->weight_hc_data).data;
              m_6.elemsize = (this->weight_hc_data).elemsize;
              m_6.elempack = (this->weight_hc_data).elempack;
              m_6.allocator = (this->weight_hc_data).allocator;
              m_6.refcount = (int *)0x0;
              m_6.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_6.dims = iVar1 + -1;
              m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                          m_6.elemsize;
              if (iVar1 == 4) {
                m_6.cstep = (long)m_6.h * (long)m_6.w;
              }
              if (this->num_output == this->hidden_size) {
                m_7.cstep = 0;
                m_7.data = (void *)0x0;
                m_7.elemsize._0_4_ = 0;
                m_7.elemsize._4_4_ = 0;
                m_7.elempack = 0;
                m_7.allocator = (Allocator *)0x0;
                m_7.dims = 0;
                m_7.w = 0;
                m_7.h = 0;
                m_7.d = 0;
                m_7.c = 0;
              }
              else {
                m_7.w = (this->weight_hr_data).w;
                m_7.h = (this->weight_hr_data).h;
                m_7.data = (this->weight_hr_data).data;
                uVar7 = (this->weight_hr_data).elemsize;
                m_7.elempack = (this->weight_hr_data).elempack;
                m_7.allocator = (this->weight_hr_data).allocator;
                m_7.elemsize._0_4_ = (undefined4)uVar7;
                m_7.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
                m_7.c = (this->weight_hr_data).d;
                m_7.d = 1;
                iVar1 = (this->weight_hr_data).dims;
                m_7.dims = iVar1 + -1;
                m_7.cstep = (uVar7 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar7;
                if (iVar1 == 4) {
                  m_7.cstep = (long)m_7.h * (long)m_7.w;
                }
              }
              m_7.refcount._4_4_ = 0;
              m_7.refcount._0_4_ = 0;
              iVar3 = lstm(bottom_blob,&m,0,&m_2,&m_3,&m_6,&m_7,&local_78,&local_c8,opt);
              uVar7 = 0;
              if (iVar3 == 0) {
                uVar6 = (ulong)(uint)(local_78.c * (int)local_78.cstep);
                if (local_78.c * (int)local_78.cstep < 1) {
                  uVar6 = uVar7;
                }
                for (; (int)uVar6 != (int)uVar7; uVar7 = uVar7 + 1) {
                  *(undefined4 *)((long)local_78.data + uVar7 * 4) = 0;
                }
                uVar6 = 0;
                uVar7 = (ulong)(uint)(local_c8.c * (int)local_c8.cstep);
                if (local_c8.c * (int)local_c8.cstep < 1) {
                  uVar7 = uVar6;
                }
                for (; (int)uVar7 != (int)uVar6; uVar6 = uVar6 + 1) {
                  *(undefined4 *)((long)local_c8.data + uVar6 * 4) = 0;
                }
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                                   (long)(this->weight_xc_data).data);
                m_2.c = (this->weight_xc_data).d;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_3.w = (this->bias_c_data).w;
                m_3.h = (this->bias_c_data).h;
                uVar7 = (this->bias_c_data).elemsize;
                m_3.data = (void *)((this->bias_c_data).cstep * uVar7 +
                                   (long)(this->bias_c_data).data);
                m_3.elempack = (this->bias_c_data).elempack;
                m_3.allocator = (this->bias_c_data).allocator;
                m_3.refcount._0_4_ = 0;
                m_3.refcount._4_4_ = 0;
                m_3.elemsize._0_4_ = (undefined4)uVar7;
                m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
                m_3.c = (this->bias_c_data).d;
                m_3.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_3.dims = iVar1 + -1;
                m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
                if (iVar1 == 4) {
                  m_3.cstep = (long)m_3.h * (long)m_3.w;
                }
                m_6.w = (this->weight_hc_data).w;
                m_6.h = (this->weight_hc_data).h;
                m_6.elemsize = (this->weight_hc_data).elemsize;
                m_6.data = (void *)((this->weight_hc_data).cstep * m_6.elemsize +
                                   (long)(this->weight_hc_data).data);
                m_6.c = (this->weight_hc_data).d;
                m_6.elempack = (this->weight_hc_data).elempack;
                m_6.allocator = (this->weight_hc_data).allocator;
                m_6.refcount = (int *)0x0;
                m_6.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_6.dims = iVar1 + -1;
                m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                            m_6.elemsize;
                if (iVar1 == 4) {
                  m_6.cstep = (long)m_6.h * (long)m_6.w;
                }
                if (this->num_output == this->hidden_size) {
                  m_7.cstep = 0;
                  m_7.data = (void *)0x0;
                  m_7.elemsize._0_4_ = 0;
                  m_7.elemsize._4_4_ = 0;
                  m_7.elempack = 0;
                  m_7.allocator = (Allocator *)0x0;
                  m_7.dims = 0;
                  m_7.w = 0;
                  m_7.h = 0;
                  m_7.d = 0;
                  m_7.c = 0;
                }
                else {
                  m_7.w = (this->weight_hr_data).w;
                  m_7.h = (this->weight_hr_data).h;
                  uVar7 = (this->weight_hr_data).elemsize;
                  m_7.data = (void *)((this->weight_hr_data).cstep * uVar7 +
                                     (long)(this->weight_hr_data).data);
                  m_7.elempack = (this->weight_hr_data).elempack;
                  m_7.allocator = (this->weight_hr_data).allocator;
                  m_7.elemsize._0_4_ = (undefined4)uVar7;
                  m_7.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
                  m_7.c = (this->weight_hr_data).d;
                  m_7.d = 1;
                  iVar1 = (this->weight_hr_data).dims;
                  m_7.dims = iVar1 + -1;
                  m_7.cstep = (uVar7 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar7
                  ;
                  if (iVar1 == 4) {
                    m_7.cstep = (long)m_7.h * (long)m_7.w;
                  }
                }
                m_7.refcount._4_4_ = 0;
                m_7.refcount._0_4_ = 0;
                iVar3 = lstm(bottom_blob,&m_1,1,&m_2,&m_3,&m_6,&m_7,&local_78,&local_c8,opt);
                uVar7 = 0;
                if (iVar3 == 0) {
                  uVar6 = (ulong)_h;
                  if ((int)_h < 1) {
                    uVar6 = uVar7;
                  }
                  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
                    __src = (void *)((long)m_1.w * uVar7 *
                                     CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                    (long)m_1.data);
                    __dest = (void *)((long)top_blob->w * uVar7 * top_blob->elemsize +
                                     (long)top_blob->data);
                    memcpy(__dest,(void *)((long)m.w * uVar7 *
                                           CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                          (long)m.data),(long)this->num_output << 2);
                    memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                           (long)this->num_output << 2);
                  }
                  iVar3 = 0;
                  uVar7 = 1;
                }
              }
            }
            cVar5 = (char)uVar7;
            piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (cVar5 == '\0') goto LAB_0032c193;
        }
        iVar3 = 0;
      }
    }
  }
LAB_0032c193:
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0032c1ca:
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(hidden_size, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}